

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_custom.cpp
# Opt level: O2

void ImGui::StyleColorsMahiDark2(void)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiStyle *pIVar4;
  
  pIVar4 = GetStyle();
  pIVar4->Colors[0].x = 1.0;
  pIVar4->Colors[0].y = 1.0;
  pIVar4->Colors[0].z = 1.0;
  pIVar4->Colors[0].w = 1.0;
  pIVar4->Colors[1].x = 0.5;
  pIVar4->Colors[1].y = 0.5;
  pIVar4->Colors[1].z = 0.5;
  pIVar4->Colors[1].w = 1.0;
  pIVar4->Colors[2].x = 0.18;
  pIVar4->Colors[2].y = 0.18;
  pIVar4->Colors[2].z = 0.18;
  pIVar4->Colors[2].w = 1.0;
  pIVar4->Colors[3].x = 0.28;
  pIVar4->Colors[3].y = 0.28;
  pIVar4->Colors[3].z = 0.28;
  pIVar4->Colors[3].w = 0.0;
  pIVar4->Colors[4].x = 0.313;
  pIVar4->Colors[4].y = 0.313;
  pIVar4->Colors[4].z = 0.313;
  pIVar4->Colors[4].w = 1.0;
  pIVar4->Colors[5].x = 0.266;
  pIVar4->Colors[5].y = 0.266;
  pIVar4->Colors[5].z = 0.266;
  pIVar4->Colors[5].w = 1.0;
  pIVar4->Colors[6].x = 0.0;
  pIVar4->Colors[6].y = 0.0;
  pIVar4->Colors[6].z = 0.0;
  pIVar4->Colors[6].w = 0.0;
  pIVar4->Colors[7].x = 0.16;
  pIVar4->Colors[7].y = 0.16;
  pIVar4->Colors[7].z = 0.16;
  pIVar4->Colors[7].w = 1.0;
  pIVar4->Colors[8].x = 0.2;
  pIVar4->Colors[8].y = 0.2;
  pIVar4->Colors[8].z = 0.2;
  pIVar4->Colors[8].w = 1.0;
  pIVar4->Colors[9].x = 0.28;
  pIVar4->Colors[9].y = 0.28;
  pIVar4->Colors[9].z = 0.28;
  pIVar4->Colors[9].w = 1.0;
  pIVar4->Colors[10].x = 0.148;
  pIVar4->Colors[10].y = 0.148;
  pIVar4->Colors[10].z = 0.148;
  pIVar4->Colors[10].w = 1.0;
  pIVar4->Colors[0xb].x = 0.148;
  pIVar4->Colors[0xb].y = 0.148;
  pIVar4->Colors[0xb].z = 0.148;
  pIVar4->Colors[0xb].w = 1.0;
  pIVar4->Colors[0xc].x = 0.148;
  pIVar4->Colors[0xc].y = 0.148;
  pIVar4->Colors[0xc].z = 0.148;
  pIVar4->Colors[0xc].w = 1.0;
  pIVar4->Colors[0xd].x = 0.195;
  pIVar4->Colors[0xd].y = 0.195;
  pIVar4->Colors[0xd].z = 0.195;
  pIVar4->Colors[0xd].w = 1.0;
  pIVar4->Colors[0xe].x = 0.16;
  pIVar4->Colors[0xe].y = 0.16;
  pIVar4->Colors[0xe].z = 0.16;
  pIVar4->Colors[0xe].w = 1.0;
  pIVar4->Colors[0xf].x = 0.277;
  pIVar4->Colors[0xf].y = 0.277;
  pIVar4->Colors[0xf].z = 0.277;
  pIVar4->Colors[0xf].w = 1.0;
  pIVar4->Colors[0x10].x = 0.3;
  pIVar4->Colors[0x10].y = 0.3;
  pIVar4->Colors[0x10].z = 0.3;
  pIVar4->Colors[0x10].w = 1.0;
  pIVar4->Colors[0x11].x = 1.0;
  pIVar4->Colors[0x11].y = 0.391;
  pIVar4->Colors[0x11].z = 0.0;
  pIVar4->Colors[0x11].w = 1.0;
  pIVar4->Colors[0x12].x = 1.0;
  pIVar4->Colors[0x12].y = 1.0;
  pIVar4->Colors[0x12].z = 1.0;
  pIVar4->Colors[0x12].w = 1.0;
  pIVar4->Colors[0x13].x = 0.391;
  pIVar4->Colors[0x13].y = 0.391;
  pIVar4->Colors[0x13].z = 0.391;
  pIVar4->Colors[0x13].w = 1.0;
  pIVar4->Colors[0x14].x = 1.0;
  pIVar4->Colors[0x14].y = 0.391;
  pIVar4->Colors[0x14].z = 0.0;
  pIVar4->Colors[0x14].w = 1.0;
  pIVar4->Colors[0x15].x = 1.0;
  pIVar4->Colors[0x15].y = 1.0;
  pIVar4->Colors[0x15].z = 1.0;
  pIVar4->Colors[0x15].w = 0.0;
  pIVar4->Colors[0x16].x = 1.0;
  pIVar4->Colors[0x16].y = 1.0;
  pIVar4->Colors[0x16].z = 1.0;
  pIVar4->Colors[0x16].w = 0.156;
  pIVar4->Colors[0x17].x = 1.0;
  pIVar4->Colors[0x17].y = 1.0;
  pIVar4->Colors[0x17].z = 1.0;
  pIVar4->Colors[0x17].w = 0.391;
  pIVar4->Colors[0x18].x = 0.313;
  pIVar4->Colors[0x18].y = 0.313;
  pIVar4->Colors[0x18].z = 0.313;
  pIVar4->Colors[0x18].w = 1.0;
  pIVar4->Colors[0x19].x = 0.469;
  pIVar4->Colors[0x19].y = 0.469;
  pIVar4->Colors[0x19].z = 0.469;
  pIVar4->Colors[0x19].w = 1.0;
  pIVar4->Colors[0x1a].x = 0.469;
  pIVar4->Colors[0x1a].y = 0.469;
  pIVar4->Colors[0x1a].z = 0.469;
  pIVar4->Colors[0x1a].w = 1.0;
  fVar1 = pIVar4->Colors[5].y;
  fVar2 = pIVar4->Colors[5].z;
  fVar3 = pIVar4->Colors[5].w;
  pIVar4->Colors[0x1b].x = pIVar4->Colors[5].x;
  pIVar4->Colors[0x1b].y = fVar1;
  pIVar4->Colors[0x1b].z = fVar2;
  pIVar4->Colors[0x1b].w = fVar3;
  pIVar4->Colors[0x1c].x = 0.391;
  pIVar4->Colors[0x1c].y = 0.391;
  pIVar4->Colors[0x1c].z = 0.391;
  pIVar4->Colors[0x1c].w = 1.0;
  pIVar4->Colors[0x1d].x = 1.0;
  pIVar4->Colors[0x1d].y = 0.391;
  pIVar4->Colors[0x1d].z = 0.0;
  pIVar4->Colors[0x1d].w = 1.0;
  pIVar4->Colors[0x1e].x = 1.0;
  pIVar4->Colors[0x1e].y = 1.0;
  pIVar4->Colors[0x1e].z = 1.0;
  pIVar4->Colors[0x1e].w = 0.25;
  pIVar4->Colors[0x1f].x = 1.0;
  pIVar4->Colors[0x1f].y = 1.0;
  pIVar4->Colors[0x1f].z = 1.0;
  pIVar4->Colors[0x1f].w = 0.67;
  pIVar4->Colors[0x20].x = 1.0;
  pIVar4->Colors[0x20].y = 0.391;
  pIVar4->Colors[0x20].z = 0.0;
  pIVar4->Colors[0x20].w = 1.0;
  pIVar4->Colors[0x21].x = 0.098;
  pIVar4->Colors[0x21].y = 0.098;
  pIVar4->Colors[0x21].z = 0.098;
  pIVar4->Colors[0x21].w = 1.0;
  pIVar4->Colors[0x22].x = 0.352;
  pIVar4->Colors[0x22].y = 0.352;
  pIVar4->Colors[0x22].z = 0.352;
  pIVar4->Colors[0x22].w = 1.0;
  pIVar4->Colors[0x23].x = 0.195;
  pIVar4->Colors[0x23].y = 0.195;
  pIVar4->Colors[0x23].z = 0.195;
  pIVar4->Colors[0x23].w = 1.0;
  pIVar4->Colors[0x24].x = 0.098;
  pIVar4->Colors[0x24].y = 0.098;
  pIVar4->Colors[0x24].z = 0.098;
  pIVar4->Colors[0x24].w = 1.0;
  pIVar4->Colors[0x25].x = 0.195;
  pIVar4->Colors[0x25].y = 0.195;
  pIVar4->Colors[0x25].z = 0.195;
  pIVar4->Colors[0x25].w = 1.0;
  pIVar4->Colors[0x26].x = 1.0;
  pIVar4->Colors[0x26].y = 0.391;
  pIVar4->Colors[0x26].z = 0.0;
  pIVar4->Colors[0x26].w = 0.781;
  pIVar4->Colors[0x27].x = 0.18;
  pIVar4->Colors[0x27].y = 0.18;
  pIVar4->Colors[0x27].z = 0.18;
  pIVar4->Colors[0x27].w = 1.0;
  pIVar4->Colors[0x28].x = 0.469;
  pIVar4->Colors[0x28].y = 0.469;
  pIVar4->Colors[0x28].z = 0.469;
  pIVar4->Colors[0x28].w = 1.0;
  pIVar4->Colors[0x29].x = 1.0;
  pIVar4->Colors[0x29].y = 0.391;
  pIVar4->Colors[0x29].z = 0.0;
  pIVar4->Colors[0x29].w = 1.0;
  pIVar4->Colors[0x2a].x = 0.586;
  pIVar4->Colors[0x2a].y = 0.586;
  pIVar4->Colors[0x2a].z = 0.586;
  pIVar4->Colors[0x2a].w = 1.0;
  pIVar4->Colors[0x2b].x = 1.0;
  pIVar4->Colors[0x2b].y = 0.391;
  pIVar4->Colors[0x2b].z = 0.0;
  pIVar4->Colors[0x2b].w = 1.0;
  pIVar4->Colors[0x31].x = 1.0;
  pIVar4->Colors[0x31].y = 1.0;
  pIVar4->Colors[0x31].z = 1.0;
  pIVar4->Colors[0x31].w = 0.156;
  pIVar4->Colors[0x32].x = 1.0;
  pIVar4->Colors[0x32].y = 0.391;
  pIVar4->Colors[0x32].z = 0.0;
  pIVar4->Colors[0x32].w = 1.0;
  pIVar4->Colors[0x33].x = 1.0;
  pIVar4->Colors[0x33].y = 0.391;
  pIVar4->Colors[0x33].z = 0.0;
  pIVar4->Colors[0x33].w = 1.0;
  pIVar4->Colors[0x34].x = 1.0;
  pIVar4->Colors[0x34].y = 0.391;
  pIVar4->Colors[0x34].z = 0.0;
  pIVar4->Colors[0x34].w = 1.0;
  pIVar4->Colors[0x35].x = 0.0;
  pIVar4->Colors[0x35].y = 0.0;
  pIVar4->Colors[0x35].z = 0.0;
  pIVar4->Colors[0x35].w = 0.586;
  pIVar4->Colors[0x36].x = 0.0;
  pIVar4->Colors[0x36].y = 0.0;
  pIVar4->Colors[0x36].z = 0.0;
  pIVar4->Colors[0x36].w = 0.586;
  return;
}

Assistant:

void StyleColorsMahiDark2() {
    ImVec4 *colors                         = ImGui::GetStyle().Colors;
    colors[ImGuiCol_Text]                  = ImVec4(1.000f, 1.000f, 1.000f, 1.000f);
    colors[ImGuiCol_TextDisabled]          = ImVec4(0.500f, 0.500f, 0.500f, 1.000f);
    colors[ImGuiCol_WindowBg]              = ImVec4(0.180f, 0.180f, 0.180f, 1.000f);
    colors[ImGuiCol_ChildBg]               = ImVec4(0.280f, 0.280f, 0.280f, 0.000f);
    colors[ImGuiCol_PopupBg]               = ImVec4(0.313f, 0.313f, 0.313f, 1.000f);
    colors[ImGuiCol_Border]                = ImVec4(0.266f, 0.266f, 0.266f, 1.000f);
    colors[ImGuiCol_BorderShadow]          = ImVec4(0.000f, 0.000f, 0.000f, 0.000f);
    colors[ImGuiCol_FrameBg]               = ImVec4(0.160f, 0.160f, 0.160f, 1.000f);
    colors[ImGuiCol_FrameBgHovered]        = ImVec4(0.200f, 0.200f, 0.200f, 1.000f);
    colors[ImGuiCol_FrameBgActive]         = ImVec4(0.280f, 0.280f, 0.280f, 1.000f);
    colors[ImGuiCol_TitleBg]               = ImVec4(0.148f, 0.148f, 0.148f, 1.000f);
    colors[ImGuiCol_TitleBgActive]         = ImVec4(0.148f, 0.148f, 0.148f, 1.000f);
    colors[ImGuiCol_TitleBgCollapsed]      = ImVec4(0.148f, 0.148f, 0.148f, 1.000f);
    colors[ImGuiCol_MenuBarBg]             = ImVec4(0.195f, 0.195f, 0.195f, 1.000f);
    colors[ImGuiCol_ScrollbarBg]           = ImVec4(0.160f, 0.160f, 0.160f, 1.000f);
    colors[ImGuiCol_ScrollbarGrab]         = ImVec4(0.277f, 0.277f, 0.277f, 1.000f);
    colors[ImGuiCol_ScrollbarGrabHovered]  = ImVec4(0.300f, 0.300f, 0.300f, 1.000f);
    colors[ImGuiCol_ScrollbarGrabActive]   = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_CheckMark]             = ImVec4(1.000f, 1.000f, 1.000f, 1.000f);
    colors[ImGuiCol_SliderGrab]            = ImVec4(0.391f, 0.391f, 0.391f, 1.000f);
    colors[ImGuiCol_SliderGrabActive]      = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_Button]                = ImVec4(1.000f, 1.000f, 1.000f, 0.000f);
    colors[ImGuiCol_ButtonHovered]         = ImVec4(1.000f, 1.000f, 1.000f, 0.156f);
    colors[ImGuiCol_ButtonActive]          = ImVec4(1.000f, 1.000f, 1.000f, 0.391f);
    colors[ImGuiCol_Header]                = ImVec4(0.313f, 0.313f, 0.313f, 1.000f);
    colors[ImGuiCol_HeaderHovered]         = ImVec4(0.469f, 0.469f, 0.469f, 1.000f);
    colors[ImGuiCol_HeaderActive]          = ImVec4(0.469f, 0.469f, 0.469f, 1.000f);
    colors[ImGuiCol_Separator]             = colors[ImGuiCol_Border];
    colors[ImGuiCol_SeparatorHovered]      = ImVec4(0.391f, 0.391f, 0.391f, 1.000f);
    colors[ImGuiCol_SeparatorActive]       = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_ResizeGrip]            = ImVec4(1.000f, 1.000f, 1.000f, 0.250f);
    colors[ImGuiCol_ResizeGripHovered]     = ImVec4(1.000f, 1.000f, 1.000f, 0.670f);
    colors[ImGuiCol_ResizeGripActive]      = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_Tab]                   = ImVec4(0.098f, 0.098f, 0.098f, 1.000f);
    colors[ImGuiCol_TabHovered]            = ImVec4(0.352f, 0.352f, 0.352f, 1.000f);
    colors[ImGuiCol_TabActive]             = ImVec4(0.195f, 0.195f, 0.195f, 1.000f);
    colors[ImGuiCol_TabUnfocused]          = ImVec4(0.098f, 0.098f, 0.098f, 1.000f);
    colors[ImGuiCol_TabUnfocusedActive]    = ImVec4(0.195f, 0.195f, 0.195f, 1.000f);
    colors[ImGuiCol_DockingPreview]        = ImVec4(1.000f, 0.391f, 0.000f, 0.781f);
    colors[ImGuiCol_DockingEmptyBg]        = ImVec4(0.180f, 0.180f, 0.180f, 1.000f);
    colors[ImGuiCol_PlotLines]             = ImVec4(0.469f, 0.469f, 0.469f, 1.000f);
    colors[ImGuiCol_PlotLinesHovered]      = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_PlotHistogram]         = ImVec4(0.586f, 0.586f, 0.586f, 1.000f);
    colors[ImGuiCol_PlotHistogramHovered]  = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_TextSelectedBg]        = ImVec4(1.000f, 1.000f, 1.000f, 0.156f);
    colors[ImGuiCol_DragDropTarget]        = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_NavHighlight]          = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_NavWindowingHighlight] = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_NavWindowingDimBg]     = ImVec4(0.000f, 0.000f, 0.000f, 0.586f);
    colors[ImGuiCol_ModalWindowDimBg]      = ImVec4(0.000f, 0.000f, 0.000f, 0.586f);
}